

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose_sse2.h
# Opt level: O0

void transpose_16bit_4x8(__m128i *in,__m128i *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined2 *in_RSI;
  undefined8 *in_RDI;
  undefined2 local_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined2 local_178;
  undefined2 uStack_176;
  undefined2 uStack_174;
  undefined2 uStack_172;
  undefined2 local_168;
  undefined2 uStack_166;
  undefined2 uStack_164;
  undefined2 uStack_162;
  undefined2 local_158;
  undefined2 uStack_156;
  undefined2 uStack_154;
  undefined2 uStack_152;
  undefined2 local_148;
  undefined2 uStack_146;
  undefined2 uStack_144;
  undefined2 uStack_142;
  undefined2 local_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 local_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  
  uVar1 = *in_RDI;
  uVar2 = in_RDI[2];
  local_118 = (undefined2)uVar1;
  uStack_116 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_114 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_112 = (undefined2)((ulong)uVar1 >> 0x30);
  local_128 = (undefined2)uVar2;
  uStack_126 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_124 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_122 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[4];
  uVar2 = in_RDI[6];
  local_138 = (undefined2)uVar1;
  uStack_136 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_134 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_132 = (undefined2)((ulong)uVar1 >> 0x30);
  local_148 = (undefined2)uVar2;
  uStack_146 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_144 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_142 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[8];
  uVar2 = in_RDI[10];
  local_158 = (undefined2)uVar1;
  uStack_156 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_154 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_152 = (undefined2)((ulong)uVar1 >> 0x30);
  local_168 = (undefined2)uVar2;
  uStack_166 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_164 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_162 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[0xc];
  uVar2 = in_RDI[0xe];
  local_178 = (undefined2)uVar1;
  uStack_176 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_174 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_172 = (undefined2)((ulong)uVar1 >> 0x30);
  local_188 = (undefined2)uVar2;
  uStack_186 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_184 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_182 = (undefined2)((ulong)uVar2 >> 0x30);
  *in_RSI = local_118;
  in_RSI[1] = local_128;
  in_RSI[2] = local_138;
  in_RSI[3] = local_148;
  in_RSI[4] = local_158;
  in_RSI[5] = local_168;
  in_RSI[6] = local_178;
  in_RSI[7] = local_188;
  in_RSI[8] = uStack_116;
  in_RSI[9] = uStack_126;
  in_RSI[10] = uStack_136;
  in_RSI[0xb] = uStack_146;
  in_RSI[0xc] = uStack_156;
  in_RSI[0xd] = uStack_166;
  in_RSI[0xe] = uStack_176;
  in_RSI[0xf] = uStack_186;
  in_RSI[0x10] = uStack_114;
  in_RSI[0x11] = uStack_124;
  in_RSI[0x12] = uStack_134;
  in_RSI[0x13] = uStack_144;
  in_RSI[0x14] = uStack_154;
  in_RSI[0x15] = uStack_164;
  in_RSI[0x16] = uStack_174;
  in_RSI[0x17] = uStack_184;
  in_RSI[0x18] = uStack_112;
  in_RSI[0x19] = uStack_122;
  in_RSI[0x1a] = uStack_132;
  in_RSI[0x1b] = uStack_142;
  in_RSI[0x1c] = uStack_152;
  in_RSI[0x1d] = uStack_162;
  in_RSI[0x1e] = uStack_172;
  in_RSI[0x1f] = uStack_182;
  return;
}

Assistant:

static inline void transpose_16bit_4x8(const __m128i *const in,
                                       __m128i *const out) {
  // Unpack 16 bit elements. Goes from:
  // in[0]: 00 01 02 03  XX XX XX XX
  // in[1]: 10 11 12 13  XX XX XX XX
  // in[2]: 20 21 22 23  XX XX XX XX
  // in[3]: 30 31 32 33  XX XX XX XX
  // in[4]: 40 41 42 43  XX XX XX XX
  // in[5]: 50 51 52 53  XX XX XX XX
  // in[6]: 60 61 62 63  XX XX XX XX
  // in[7]: 70 71 72 73  XX XX XX XX
  // to:
  // a0:    00 10 01 11  02 12 03 13
  // a1:    20 30 21 31  22 32 23 33
  // a2:    40 50 41 51  42 52 43 53
  // a3:    60 70 61 71  62 72 63 73
  const __m128i a0 = _mm_unpacklo_epi16(in[0], in[1]);
  const __m128i a1 = _mm_unpacklo_epi16(in[2], in[3]);
  const __m128i a2 = _mm_unpacklo_epi16(in[4], in[5]);
  const __m128i a3 = _mm_unpacklo_epi16(in[6], in[7]);

  // Unpack 32 bit elements resulting in:
  // b0: 00 10 20 30  01 11 21 31
  // b1: 40 50 60 70  41 51 61 71
  // b2: 02 12 22 32  03 13 23 33
  // b3: 42 52 62 72  43 53 63 73
  const __m128i b0 = _mm_unpacklo_epi32(a0, a1);
  const __m128i b1 = _mm_unpacklo_epi32(a2, a3);
  const __m128i b2 = _mm_unpackhi_epi32(a0, a1);
  const __m128i b3 = _mm_unpackhi_epi32(a2, a3);

  // Unpack 64 bit elements resulting in:
  // out[0]: 00 10 20 30  40 50 60 70
  // out[1]: 01 11 21 31  41 51 61 71
  // out[2]: 02 12 22 32  42 52 62 72
  // out[3]: 03 13 23 33  43 53 63 73
  out[0] = _mm_unpacklo_epi64(b0, b1);
  out[1] = _mm_unpackhi_epi64(b0, b1);
  out[2] = _mm_unpacklo_epi64(b2, b3);
  out[3] = _mm_unpackhi_epi64(b2, b3);
}